

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psi.cpp
# Opt level: O1

int __thiscall
pg::PSISolver::switch_strategy
          (PSISolver *this,WorkerP *__lace_worker,Task *__lace_dq_head,int pl,int begin,int count)

{
  ulong uVar1;
  Game *pGVar2;
  bitset *pbVar3;
  uint64_t *puVar4;
  Worker *pWVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  bool bVar9;
  int iVar10;
  ulong uVar11;
  Error *this_00;
  uint b;
  int to;
  uint uVar12;
  uint uVar13;
  uint a;
  TD_switch_strategy *t;
  uint *puVar14;
  ulong uVar15;
  int local_70;
  
  lVar8 = halt;
  lVar7 = str;
  lVar6 = done;
  if (count < 0x40) {
    if (count < 1) {
      local_70 = 0;
    }
    else {
      pGVar2 = (this->super_Solver).game;
      pbVar3 = (this->super_Solver).disabled;
      uVar15 = 0;
      local_70 = 0;
      do {
        uVar1 = uVar15 + (long)begin;
        iVar10 = *(int *)(lVar6 + uVar1 * 4);
        if (iVar10 != 3) {
          if (iVar10 == 0) {
            this_00 = (Error *)__cxa_allocate_exception(0x40);
            Error::Error(this_00,"logic error",
                         "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]oink/src/solvers/psi.cpp"
                         ,0x145);
            __cxa_throw(this_00,&Error::typeinfo,Error::~Error);
          }
          if ((uint)(((pGVar2->_owner)._bits[uVar1 >> 6] >> (uVar1 & 0x3f) & 1) != 0) == pl) {
            uVar13 = pGVar2->_outedges[pGVar2->_firstouts[uVar1]];
            if (uVar13 != 0xffffffff) {
              uVar12 = *(uint *)(lVar7 + uVar1 * 4);
              puVar4 = pbVar3->_bits;
              puVar14 = (uint *)(pGVar2->_outedges + (long)pGVar2->_firstouts[uVar1] + 1);
              do {
                uVar11 = (ulong)(int)uVar13;
                if (((puVar4[uVar11 >> 6] >> (uVar11 & 0x3f) & 1) == 0) && (uVar13 != uVar12)) {
                  if (pl == 0) {
                    a = -(uint)(*(int *)(lVar8 + (long)(int)uVar12 * 4) != 0) | uVar12;
                    b = -(uint)(*(int *)(lVar8 + uVar11 * 4) != 0) | uVar13;
                  }
                  else {
                    a = -(uint)(*(int *)(lVar8 + uVar11 * 4) != 0) | uVar13;
                    b = -(uint)(*(int *)(lVar8 + (long)(int)uVar12 * 4) != 0) | uVar12;
                  }
                  bVar9 = si_val_less((PSISolver *)0x0,a,b);
                  if (bVar9) {
                    *(uint *)(lVar7 + uVar1 * 4) = uVar13;
                    local_70 = local_70 + 1;
                    uVar12 = uVar13;
                  }
                }
                uVar13 = *puVar14;
                puVar14 = puVar14 + 1;
              } while (uVar13 != 0xffffffff);
            }
          }
        }
        uVar15 = uVar15 + 1;
      } while (uVar15 != (uint)count);
    }
  }
  else {
    if (__lace_worker->end == __lace_dq_head) {
      lace_abort_stack_overflow();
    }
    uVar13 = (uint)count >> 1;
    __lace_dq_head->f = switch_strategy_WRAP;
    (__lace_dq_head->thief)._M_b._M_p = (__pointer_type)0x1;
    *(PSISolver **)__lace_dq_head->d = this;
    *(int *)(__lace_dq_head->d + 8) = pl;
    *(uint *)(__lace_dq_head->d + 0xc) = uVar13 + begin;
    *(uint *)(__lace_dq_head->d + 0x10) = count - uVar13;
    pWVar5 = __lace_worker->_public;
    if (__lace_worker->allstolen == '\0') {
      if (pWVar5->movesplit != '\0') {
        switch_strategy();
      }
    }
    else {
      if (pWVar5->movesplit != '\0') {
        pWVar5->movesplit = '\0';
      }
      uVar15 = (long)__lace_dq_head - (long)__lace_worker->dq;
      LOCK();
      pWVar5->ts = (TailSplit)
                   ((uVar15 >> 6 & 0xffffffff | (uVar15 & 0xffffffffffffffc0) << 0x1a) + 0x100000000
                   );
      UNLOCK();
      pWVar5->allstolen = '\0';
      __lace_worker->split = __lace_dq_head + 1;
      __lace_worker->allstolen = '\0';
    }
    iVar10 = switch_strategy(this,__lace_worker,__lace_dq_head + 1,pl,begin,uVar13);
    if ((__lace_worker->_public->movesplit == '\0') && (__lace_worker->split <= __lace_dq_head)) {
      (__lace_dq_head->thief)._M_b._M_p = (__pointer_type)0x0;
      local_70 = switch_strategy(*(PSISolver **)__lace_dq_head->d,__lace_worker,__lace_dq_head,
                                 *(int *)(__lace_dq_head->d + 8),*(int *)(__lace_dq_head->d + 0xc),
                                 *(int *)(__lace_dq_head->d + 0x10));
    }
    else {
      local_70 = switch_strategy_SYNC_SLOW(__lace_worker,__lace_dq_head);
    }
    local_70 = local_70 + iVar10;
  }
  return local_70;
}

Assistant:

int
PSISolver::switch_strategy(WorkerP* __lace_worker, Task* __lace_dq_head, int pl, int begin, int count)
{
    // some cut-off point...
    if (count < 64) {
        int res = 0;
        for (int i=0; i<count; i++) {
            int n = begin+i;

            if (done[n] == 3) continue; // skip "disabled or won"
            if (done[n] == 0) LOGIC_ERROR; // expecting done==1 or done==2
            if (owner(n) != pl) continue; // only change strategy if owner

            int cur_strat = str[n];
            for (auto curedge = outs(n); *curedge != -1; curedge++) {
                int to = *curedge;
                if (disabled[to]) continue; // skip strategy to disabled
                if (to == cur_strat) continue; // skip strategy to same
                if (pl == 0) {
                    // improving for player Even
                    if (si_val_less(halt[cur_strat] ? -1 : cur_strat, halt[to] ? -1 : to)) {
                        str[n] = cur_strat = to;
                        res++;
                    }
                } else {
                    // improving for player Odd
                    if (si_val_less(halt[to] ? -1 : to, halt[cur_strat] ? -1 : cur_strat)) {
                        str[n] = cur_strat = to;
                        res++;
                    }
                }
            }
        }
        return res;
    } else {
        SPAWN(switch_strategy, this, pl, begin+count/2, count-count/2);
        int res = CALL(switch_strategy, this, pl, begin, count/2);
        res += SYNC(switch_strategy);
        return res;
    }
}